

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

TranslationBlock *
tb_gen_code_mips64(CPUState *cpu,target_ulong pc,target_ulong cs_base,uint32_t flags,int cflags)

{
  byte *pbVar1;
  ushort uVar2;
  TCGContext_conflict5 *s;
  CPUArchState_conflict11 *pCVar3;
  TCGContext_conflict6 *pTVar4;
  byte *pbVar5;
  uc_struct_conflict6 *uc;
  uintptr_t uVar6;
  uintptr_t *puVar7;
  PageDesc *pPVar8;
  tb_page_addr_t tVar9;
  byte bVar10;
  TranslationBlock *pTVar11;
  ulong extraout_RAX;
  TranslationBlock *tb;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  uint16_t *puVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  target_ulong tVar23;
  tb_page_addr_t phys2;
  bool bVar24;
  bool bVar25;
  PageDesc *p2;
  PageDesc *p;
  PageDesc *local_90;
  uint local_88;
  undefined4 uStack_84;
  void *local_80;
  uint32_t local_74;
  uint local_70;
  uint32_t local_6c;
  tb_page_addr_t local_68;
  target_ulong local_60;
  CPUArchState_conflict11 *local_58;
  ulong local_50;
  CPUState *local_48;
  target_ulong local_40;
  TranslationBlock *local_38;
  
  s = (TCGContext_conflict5 *)cpu->uc->tcg_ctx;
  pCVar3 = (CPUArchState_conflict11 *)cpu->env_ptr;
  local_6c = flags;
  local_60 = pc;
  local_40 = cs_base;
  local_68 = get_page_addr_code_mips64(pCVar3,pc);
  uVar15 = cflags | 0x10000;
  if (local_68 != 0xffffffffffffffff) {
    uVar15 = cflags;
  }
  uVar14 = cpu->cluster_index;
  tb = (TranslationBlock *)(ulong)uVar14;
  uVar20 = cpu->singlestep_enabled;
  puVar19 = (uint16_t *)(ulong)uVar20;
  pTVar11 = tcg_tb_alloc_mips64(s);
  if (pTVar11 == (TranslationBlock *)0x0) {
LAB_008985e0:
    tb_gen_code_mips64_cold_2();
LAB_008985ea:
    (tb->tc).size = local_50;
    s->code_gen_ptr =
         (void *)((long)local_80 + ((ulong)puVar19 & 0xffffffff) + local_50 + 0xf &
                 0xfffffffffffffff0);
    *(undefined1 (*) [16])(tb->jmp_list_next + 1) = (undefined1  [16])0x0;
    tb->jmp_list_head = 0;
    tb->jmp_list_next[0] = 0;
    tb->jmp_dest[1] = 0;
    if ((ulong)tb->jmp_reset_offset[0] != 0xffff) {
      tb_set_jmp_target_mips64
                ((TranslationBlock_conflict *)tb,0,
                 (ulong)tb->jmp_reset_offset[0] + (long)(tb->tc).ptr);
    }
    pCVar3 = local_58;
    if (tb->jmp_reset_offset[1] != 0xffff) {
      tb_set_jmp_target_mips64
                ((TranslationBlock_conflict *)tb,1,
                 (ulong)tb->jmp_reset_offset[1] + (long)(tb->tc).ptr);
    }
    uVar21 = (local_60 + tb->size) - 1 & 0xfffffffffffff000;
    phys2 = 0xffffffffffffffff;
    if ((local_60 & 0xfffffffffffff000) != uVar21) {
      phys2 = get_page_addr_code_mips64(pCVar3,uVar21);
    }
    tVar9 = local_68;
    uc = (uc_struct_conflict6 *)cpu->uc;
    local_90 = (PageDesc *)0x0;
    pTVar11 = tb;
    if (local_68 == 0xffffffffffffffff) {
      if ((tb->cflags & 0x10000) == 0) {
        __assert_fail("tb->cflags & CF_NOCACHE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
                      ,0x66c,
                      "TranslationBlock *tb_link_page(struct uc_struct *, TranslationBlock *, tb_page_addr_t, tb_page_addr_t)"
                     );
      }
      *(undefined4 *)tb->page_addr = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 4) = 0xffffffff;
      *(undefined4 *)(tb->page_addr + 1) = 0xffffffff;
      *(undefined4 *)((long)tb->page_addr + 0xc) = 0xffffffff;
    }
    else {
      page_lock_pair(uc,(PageDesc **)&local_88,local_68,&local_90,phys2,1);
      puVar7 = (uintptr_t *)CONCAT44(uStack_84,local_88);
      tb->page_addr[0] = tVar9 & 0xfffffffffffff000;
      tb->page_next[0] = *puVar7;
      uVar6 = *puVar7;
      *puVar7 = (uintptr_t)tb;
      g_free((gpointer)puVar7[1]);
      puVar7[1] = 0;
      *(undefined4 *)(puVar7 + 2) = 0;
      if (uVar6 == 0) {
        tlb_protect_code_mips64(uc,tVar9 & 0xfffffffffffff000);
      }
      pPVar8 = local_90;
      if (local_90 == (PageDesc *)0x0) {
        tb->page_addr[1] = 0xffffffffffffffff;
      }
      else {
        tb->page_addr[1] = phys2;
        tb->page_next[1] = local_90->first_tb;
        uVar6 = local_90->first_tb;
        local_90->first_tb = (ulong)tb | 1;
        g_free(local_90->code_bitmap);
        pPVar8->code_bitmap = (unsigned_long *)0x0;
        pPVar8->code_write_count = 0;
        if (uVar6 == 0) {
          tlb_protect_code_mips64(uc,phys2);
        }
      }
      if ((tb->cflags >> 0x10 & 1) == 0) {
        local_38 = (TranslationBlock *)0x0;
        uVar15 = (int)local_68 * -0x7a143589 + 0x24234429;
        uVar22 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar15 = (int)(local_68 >> 0x20) * -0x7a143589 + 0x85ebca78;
        uVar14 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar15 = (int)tb->pc * -0x7a143589 + 1;
        uVar20 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar15 = (int)(tb->pc >> 0x20) * -0x7a143589 + 0x61c88650;
        uVar15 = uVar15 * 0x2000 | uVar15 >> 0x13;
        uVar15 = (uVar15 * -0x193c0000 | uVar15 * -0x61c8864f >> 0xe) +
                 tb->flags * -0x3d4d51c3 +
                 (uVar22 * 0x3c6ef362 | (uint)((int)(uVar22 * -0x61c8864f) < 0)) +
                 (uVar14 * 0x1bbcd880 | uVar14 * -0x61c8864f >> 0x19) +
                 (uVar20 * 0x779b1000 | uVar20 * -0x61c8864f >> 0x14) + 0x1c;
        uVar15 = (tb->cflags & 0xff0affff) * -0x3d4d51c3 +
                 (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = tb->trace_vcpu_dstate * -0x3d4d51c3 +
                 (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = (uVar15 * 0x20000 | uVar15 >> 0xf) * 0x27d4eb2f;
        uVar15 = (uVar15 >> 0xf ^ uVar15) * -0x7a143589;
        uVar15 = (uVar15 >> 0xd ^ uVar15) * -0x3d4d51c3;
        uVar15 = uVar15 >> 0x10 ^ uVar15;
        tb->hash = uVar15;
        qht_insert((uc_struct_conflict5 *)uc,&(uc->tcg_ctx->tb_ctx).htable,tb,uVar15,&local_38);
        if (local_38 != (TranslationBlock *)0x0) {
          tb_page_remove((PageDesc *)CONCAT44(uStack_84,local_88),tb);
          lVar13 = CONCAT44(uStack_84,local_88);
          g_free(*(gpointer *)(lVar13 + 8));
          *(undefined8 *)(lVar13 + 8) = 0;
          *(undefined4 *)(lVar13 + 0x10) = 0;
          pTVar11 = local_38;
          if (local_90 != (PageDesc *)0x0) {
            tb_page_remove(local_90,tb);
            pPVar8 = local_90;
            g_free(local_90->code_bitmap);
            pPVar8->code_bitmap = (unsigned_long *)0x0;
            pPVar8->code_write_count = 0;
            pTVar11 = local_38;
          }
        }
      }
    }
    if (pTVar11 == tb) {
      tcg_tb_insert_mips64(s,tb);
      pTVar11 = tb;
    }
    else {
      lVar13 = (long)s->uc->qemu_icache_linesize;
      s->code_gen_ptr = (void *)((long)local_80 - (-lVar13 & lVar13 + 0x9fU));
    }
    return pTVar11;
  }
  local_74 = uVar14 << 0x18 | uVar15 & 0xffffff;
  uVar15 = uVar15 & 0x7fff;
  uVar14 = 0x200;
  if (uVar15 < 0x200) {
    uVar14 = uVar15;
  }
  if (uVar15 == 0) {
    uVar14 = 0x200;
  }
  uVar15 = 1;
  if (uVar20 == 0) {
    uVar15 = uVar14;
  }
  local_48 = (CPUState *)(pCVar3[-3].tcs[0xc].gpr + 0x12);
  tb = pTVar11;
  local_58 = pCVar3;
LAB_0089839a:
  local_80 = s->code_gen_ptr;
  (tb->tc).ptr = local_80;
  tb->pc = local_60;
  tb->cs_base = local_40;
  tb->flags = local_6c;
  tb->cflags = local_74;
  tb->orig_tb = (TranslationBlock *)0x0;
  tb->trace_vcpu_dstate = (uint32_t)cpu->trace_dstate[0];
  s->tb_cflags = local_74;
  puVar19 = tb->jmp_reset_offset;
  do {
    tcg_func_start_mips64(s);
    s->cpu = local_48;
    local_70 = uVar15;
    gen_intermediate_code_mips64(cpu,tb,uVar15);
    s->cpu = (CPUState *)0x0;
    tb->jmp_reset_offset[0] = 0xffff;
    tb->jmp_reset_offset[1] = 0xffff;
    s->tb_jmp_reset_offset = puVar19;
    s->tb_jmp_insn_offset = tb->jmp_target_arg;
    s->tb_jmp_target_addr = (uintptr_t *)0x0;
    uVar15 = tcg_gen_code_mips64(s,tb);
    if (-1 < (int)uVar15) {
      local_50 = (ulong)uVar15;
      pbVar1 = (byte *)((long)local_80 + local_50);
      uVar2 = tb->icount;
      pbVar18 = pbVar1;
      if ((ulong)uVar2 == 0) goto LAB_008985b0;
      pTVar4 = cpu->uc->tcg_ctx;
      pbVar5 = (byte *)pTVar4->code_gen_highwater;
      uVar21 = 0;
      goto LAB_008984b2;
    }
    tb_gen_code_mips64_cold_1();
    uVar15 = local_88;
  } while ((extraout_RAX & 1) == 0);
  goto LAB_008985c3;
  while (uVar21 = uVar21 + 1, uVar21 != uVar2) {
LAB_008984b2:
    lVar13 = 0;
    do {
      if (uVar21 == 0) {
        pTVar11 = tb;
        if (lVar13 == 0) goto LAB_008984c9;
        tVar23 = 0;
      }
      else {
        pTVar11 = (TranslationBlock *)(pTVar4->gen_insn_data[uVar21 - 1] + lVar13);
LAB_008984c9:
        tVar23 = pTVar11->pc;
      }
      uVar12 = pTVar4->gen_insn_data[uVar21][lVar13] - tVar23;
      pbVar17 = pbVar18;
      do {
        uVar16 = (long)uVar12 >> 7;
        bVar24 = 0x3f < uVar12;
        bVar25 = (uVar12 & 0x40) == 0;
        pbVar18 = pbVar17 + 1;
        bVar10 = (byte)uVar12 | 0x80;
        if (!bVar24 || !bVar25 && uVar16 == 0xffffffffffffffff) {
          bVar10 = (byte)uVar12 & 0x7f;
        }
        *pbVar17 = bVar10;
        uVar12 = uVar16;
        pbVar17 = pbVar18;
      } while (bVar24 && (bVar25 || uVar16 != 0xffffffffffffffff));
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (uVar21 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)pTVar4->gen_insn_end_off[uVar21 - 1];
    }
    uVar12 = pTVar4->gen_insn_end_off[uVar21] - uVar12;
    do {
      uVar16 = (long)uVar12 >> 7;
      bVar24 = 0x3f < uVar12;
      bVar25 = (uVar12 & 0x40) == 0;
      pbVar18 = pbVar17 + 1;
      bVar10 = (byte)uVar12 | 0x80;
      if (!bVar24 || !bVar25 && uVar16 == 0xffffffffffffffff) {
        bVar10 = (byte)uVar12 & 0x7f;
      }
      *pbVar17 = bVar10;
      uVar12 = uVar16;
      pbVar17 = pbVar18;
    } while (bVar24 && (bVar25 || uVar16 != 0xffffffffffffffff));
    if (pbVar5 < pbVar18) {
      puVar19 = (uint16_t *)0xffffffff;
      goto LAB_008985ba;
    }
  }
LAB_008985b0:
  puVar19 = (uint16_t *)(ulong)(uint)((int)pbVar18 - (int)pbVar1);
LAB_008985ba:
  if (-1 < (int)puVar19) goto LAB_008985ea;
LAB_008985c3:
  tb = tcg_tb_alloc_mips64(s);
  uVar15 = local_70;
  if (tb == (TranslationBlock *)0x0) goto LAB_008985e0;
  goto LAB_0089839a;
}

Assistant:

TranslationBlock *tb_gen_code(CPUState *cpu,
                              target_ulong pc, target_ulong cs_base,
                              uint32_t flags, int cflags)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
    CPUArchState *env = cpu->env_ptr;
    TranslationBlock *tb, *existing_tb;
    tb_page_addr_t phys_pc, phys_page2;
    target_ulong virt_page2;
    tcg_insn_unit *gen_code_buf;
    int gen_code_size, search_size, max_insns;

    assert_memory_lock();
#ifdef HAVE_PTHREAD_JIT_PROTECT
    tb_exec_unlock(tcg_ctx);
#endif
    phys_pc = get_page_addr_code(env, pc);

    if (phys_pc == -1) {
        /* Generate a temporary TB; do not cache */
        cflags |= CF_NOCACHE;
    }

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    max_insns = cflags & CF_COUNT_MASK;
    if (max_insns == 0) {
        max_insns = CF_COUNT_MASK;
    }
    if (max_insns > TCG_MAX_INSNS) {
        max_insns = TCG_MAX_INSNS;
    }
    if (cpu->singlestep_enabled) {
        max_insns = 1;
    }

 buffer_overflow:
    tb = tcg_tb_alloc(tcg_ctx);
    if (unlikely(!tb)) {
        /* flush must be done */
        tb_flush(cpu);
        mmap_unlock();
        /* Make the execution loop process the flush as soon as possible.  */
        cpu->exception_index = EXCP_INTERRUPT;
        cpu_loop_exit(cpu);
    }

    gen_code_buf = tcg_ctx->code_gen_ptr;
    tb->tc.ptr = gen_code_buf;
    tb->pc = pc;
    tb->cs_base = cs_base;
    tb->flags = flags;
    tb->cflags = cflags;
    tb->orig_tb = NULL;
    tb->trace_vcpu_dstate = *cpu->trace_dstate;
    tcg_ctx->tb_cflags = cflags;
 tb_overflow:

    tcg_func_start(tcg_ctx);

    tcg_ctx->cpu = env_cpu(env);
    UC_TRACE_START(UC_TRACE_TB_TRANS);
    gen_intermediate_code(cpu, tb, max_insns);
    UC_TRACE_END(UC_TRACE_TB_TRANS, "[uc] translate tb 0x%" PRIx64 ": ", tb->pc);
    tcg_ctx->cpu = NULL;

    /* generate machine code */
    tb->jmp_reset_offset[0] = TB_JMP_RESET_OFFSET_INVALID;
    tb->jmp_reset_offset[1] = TB_JMP_RESET_OFFSET_INVALID;
    tcg_ctx->tb_jmp_reset_offset = tb->jmp_reset_offset;
    if (TCG_TARGET_HAS_direct_jump) {
        tcg_ctx->tb_jmp_insn_offset = tb->jmp_target_arg;
        tcg_ctx->tb_jmp_target_addr = NULL;
    } else {
        tcg_ctx->tb_jmp_insn_offset = NULL;
        tcg_ctx->tb_jmp_target_addr = tb->jmp_target_arg;
    }

    gen_code_size = tcg_gen_code(tcg_ctx, tb);
    if (unlikely(gen_code_size < 0)) {
        switch (gen_code_size) {
        case -1:
            /*
             * Overflow of code_gen_buffer, or the current slice of it.
             *
             * TODO: We don't need to re-do gen_intermediate_code, nor
             * should we re-do the tcg optimization currently hidden
             * inside tcg_gen_code.  All that should be required is to
             * flush the TBs, allocate a new TB, re-initialize it per
             * above, and re-do the actual code generation.
             */
            goto buffer_overflow;

        case -2:
            /*
             * The code generated for the TranslationBlock is too large.
             * The maximum size allowed by the unwind info is 64k.
             * There may be stricter constraints from relocations
             * in the tcg backend.
             *
             * Try again with half as many insns as we attempted this time.
             * If a single insn overflows, there's a bug somewhere...
             */
            max_insns = tb->icount;
            assert(max_insns > 1);
            max_insns /= 2;
            goto tb_overflow;

        default:
            g_assert_not_reached();
        }
    }
    search_size = encode_search(cpu->uc, tb, (uint8_t *)gen_code_buf + gen_code_size);
    if (unlikely(search_size < 0)) {
        goto buffer_overflow;
    }
    tb->tc.size = gen_code_size;

    tcg_ctx->code_gen_ptr = (void *)
        ROUND_UP((uintptr_t)gen_code_buf + gen_code_size + search_size,
                 CODE_GEN_ALIGN);

    /* init jump list */
    tb->jmp_list_head = (uintptr_t)NULL;
    tb->jmp_list_next[0] = (uintptr_t)NULL;
    tb->jmp_list_next[1] = (uintptr_t)NULL;
    tb->jmp_dest[0] = (uintptr_t)NULL;
    tb->jmp_dest[1] = (uintptr_t)NULL;

    /* init original jump addresses which have been set during tcg_gen_code() */
    if (tb->jmp_reset_offset[0] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 0);
    }
    if (tb->jmp_reset_offset[1] != TB_JMP_RESET_OFFSET_INVALID) {
        tb_reset_jump(tb, 1);
    }

    /* check next page if needed */
    virt_page2 = (pc + tb->size - 1) & TARGET_PAGE_MASK;
    phys_page2 = -1;
    if ((pc & TARGET_PAGE_MASK) != virt_page2) {
        phys_page2 = get_page_addr_code(env, virt_page2);
    }
    /*
     * No explicit memory barrier is required -- tb_link_page() makes the
     * TB visible in a consistent state.
     */
    existing_tb = tb_link_page(cpu->uc, tb, phys_pc, phys_page2);
    /* if the TB already exists, discard what we just translated */
    if (unlikely(existing_tb != tb)) {
        uintptr_t orig_aligned = (uintptr_t)gen_code_buf;

        orig_aligned -= ROUND_UP(sizeof(*tb), tcg_ctx->uc->qemu_icache_linesize);
        tcg_ctx->code_gen_ptr = (void *)orig_aligned;
        return existing_tb;
    }
    tcg_tb_insert(tcg_ctx, tb);
    return tb;
}